

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O3

void __thiscall google::CapturedStream::Capture(CapturedStream *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  LogMessage LStack_78;
  
  if ((this->uncaptured_fd_).fd_ == -1) {
    iVar1 = dup(this->fd_);
    if ((this->uncaptured_fd_).fd_ != -1) {
      glog_internal_namespace_::FileDescriptor::unsafe_close(&this->uncaptured_fd_);
    }
    (this->uncaptured_fd_).fd_ = iVar1;
    if (iVar1 == -1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&LStack_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                 ,0x138);
      poVar3 = LogMessage::stream(&LStack_78);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"Check failed: uncaptured_fd_ ",0x1d);
    }
    else {
      iVar1 = open((this->filename_)._M_dataplus._M_p,0x241,0x180);
      if (iVar1 == -1) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&LStack_78,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                   ,0x13d);
        poVar3 = LogMessage::stream(&LStack_78);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Check failed: cap_fd ",0x15);
      }
      else {
        fflush((FILE *)0x0);
        iVar2 = dup2(iVar1,this->fd_);
        if (iVar2 == -1) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&LStack_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                     ,0x141);
          poVar3 = LogMessage::stream(&LStack_78);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Check failed: dup2(cap_fd.get(), fd_) != -1 ",0x2c);
        }
        else {
          iVar1 = close(iVar1);
          if (iVar1 != -1) {
            return;
          }
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&LStack_78,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
                     ,0x142);
          poVar3 = LogMessage::stream(&LStack_78);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Check failed: cap_fd.close() != -1 ",0x23);
        }
      }
    }
  }
  else {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_78,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x136);
    poVar3 = LogMessage::stream(&LStack_78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Check failed: !uncaptured_fd_ ",0x1e)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", Stream ",9);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->fd_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," already captured!",0x12);
  }
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_78);
}

Assistant:

void Capture() {
    // Keep original stream for later
    CHECK(!uncaptured_fd_) << ", Stream " << fd_ << " already captured!";
    uncaptured_fd_.reset(dup(fd_));
    CHECK(uncaptured_fd_);

    // Open file to save stream to
    FileDescriptor cap_fd{open(filename_.c_str(), O_CREAT | O_TRUNC | O_WRONLY,
                               S_IRUSR | S_IWUSR)};
    CHECK(cap_fd);

    // Send stdout/stderr to this file
    fflush(nullptr);
    CHECK(dup2(cap_fd.get(), fd_) != -1);
    CHECK(cap_fd.close() != -1);
  }